

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_DeletionMarkers2::_Run(_Test_DeletionMarkers2 *this)

{
  Cache *pCVar1;
  _func_int **pp_Var2;
  int iVar3;
  undefined1 local_230 [56];
  void *local_1f8;
  Env *local_1f0;
  Logger *local_1e8;
  int local_1e0;
  undefined4 uStack_1dc;
  int iStack_1d8;
  undefined4 uStack_1d4;
  undefined1 local_1d0 [24];
  stringstream local_1b8 [392];
  DB local_30;
  
  pCVar1 = (Cache *)(local_1d0 + 0x10);
  local_1d0._0_8_ = pCVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"foo","");
  pp_Var2 = (_func_int **)(local_230 + 0x10);
  local_230._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"v1","");
  local_230._32_8_ = local_1d0._0_8_;
  local_230._40_8_ = local_1d0._8_8_;
  local_1e0 = local_230._0_4_;
  uStack_1dc = local_230._4_4_;
  iStack_1d8 = local_230._8_4_;
  uStack_1d4 = local_230._12_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_1e8);
  if (local_1e8 != (Logger *)0x0) {
    operator_delete__(local_1e8);
  }
  if ((_func_int **)local_230._0_8_ != pp_Var2) {
    operator_delete((void *)local_230._0_8_);
  }
  if ((Cache *)local_1d0._0_8_ != pCVar1) {
    operator_delete((void *)local_1d0._0_8_);
  }
  local_1d0[0] = (string)0x1;
  local_1d0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0._16_4_ = 0x56a;
  std::__cxx11::stringstream::stringstream(local_1b8);
  DBImpl::TEST_CompactMemTable((DBImpl *)local_230);
  test::Tester::IsOk((Tester *)local_1d0,(Status *)local_230);
  if ((_func_int **)local_230._0_8_ != (_func_int **)0x0) {
    operator_delete__((void *)local_230._0_8_);
  }
  test::Tester::~Tester((Tester *)local_1d0);
  local_1d0[0] = (string)0x1;
  local_1d0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0._16_4_ = 0x56c;
  std::__cxx11::stringstream::stringstream(local_1b8);
  iVar3 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,2);
  local_230._0_4_ = iVar3;
  local_230._32_4_ = 1;
  test::Tester::IsEq<int,int>((Tester *)local_1d0,(int *)local_230,(int *)(local_230 + 0x20));
  test::Tester::~Tester((Tester *)local_1d0);
  local_1d0._0_8_ = pCVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"a","");
  local_230._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"begin","");
  local_230._32_8_ = local_1d0._0_8_;
  local_230._40_8_ = local_1d0._8_8_;
  local_1e0 = local_230._0_4_;
  uStack_1dc = local_230._4_4_;
  iStack_1d8 = local_230._8_4_;
  uStack_1d4 = local_230._12_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_1f0);
  if (local_1f0 != (Env *)0x0) {
    operator_delete__(local_1f0);
  }
  if ((_func_int **)local_230._0_8_ != pp_Var2) {
    operator_delete((void *)local_230._0_8_);
  }
  if ((Cache *)local_1d0._0_8_ != pCVar1) {
    operator_delete((void *)local_1d0._0_8_);
  }
  local_1d0._0_8_ = pCVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"z","");
  local_230._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"end","");
  local_230._32_8_ = local_1d0._0_8_;
  local_230._40_8_ = local_1d0._8_8_;
  local_1e0 = local_230._0_4_;
  uStack_1dc = local_230._4_4_;
  iStack_1d8 = local_230._8_4_;
  uStack_1d4 = local_230._12_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(&local_1f8);
  if (local_1f8 != (void *)0x0) {
    operator_delete__(local_1f8);
  }
  if ((_func_int **)local_230._0_8_ != pp_Var2) {
    operator_delete((void *)local_230._0_8_);
  }
  if ((Cache *)local_1d0._0_8_ != pCVar1) {
    operator_delete((void *)local_1d0._0_8_);
  }
  DBImpl::TEST_CompactMemTable((DBImpl *)&stack0xffffffffffffffd0);
  if ((_Base_ptr)local_30._vptr_DB != (_Base_ptr)0x0) {
    operator_delete__(local_30._vptr_DB);
  }
  local_1d0[0] = (string)0x1;
  local_1d0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0._16_4_ = 0x572;
  std::__cxx11::stringstream::stringstream(local_1b8);
  iVar3 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,2);
  local_230._32_4_ = 1;
  local_230._0_4_ = iVar3;
  test::Tester::IsEq<int,int>((Tester *)local_1d0,(int *)local_230,(int *)(local_230 + 0x20));
  test::Tester::~Tester((Tester *)local_1d0);
  local_1d0[0] = (string)0x1;
  local_1d0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0._16_4_ = 0x573;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_230._0_4_ = DBTest::NumTableFilesAtLevel(&this->super_DBTest,1);
  local_230._32_4_ = 1;
  test::Tester::IsEq<int,int>((Tester *)local_1d0,(int *)local_230,(int *)(local_230 + 0x20));
  test::Tester::~Tester((Tester *)local_1d0);
  local_1d0._0_8_ = pCVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"foo","");
  local_230._32_8_ = local_230._32_8_ & 0xffffffffffffff00;
  local_230._0_8_ = local_1d0._0_8_;
  local_230._8_4_ = local_1d0._8_4_;
  local_230._12_4_ = local_1d0._12_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[3])(local_230 + 0x30);
  if ((Comparator *)local_230._48_8_ != (Comparator *)0x0) {
    operator_delete__((void *)local_230._48_8_);
  }
  if ((Cache *)local_1d0._0_8_ != pCVar1) {
    operator_delete((void *)local_1d0._0_8_);
  }
  local_1d0[0] = (string)0x1;
  local_1d0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0._16_4_ = 0x576;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_230._32_8_ = "foo";
  local_230._40_8_ = (FilterPolicy *)0x3;
  DBTest::AllEntriesFor_abi_cxx11_
            ((string *)local_230,&this->super_DBTest,(Slice *)(local_230 + 0x20));
  test::Tester::IsEq<std::__cxx11::string,char[12]>
            ((Tester *)local_1d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
             (char (*) [12])"[ DEL, v1 ]");
  if ((_func_int **)local_230._0_8_ != pp_Var2) {
    operator_delete((void *)local_230._0_8_);
  }
  test::Tester::~Tester((Tester *)local_1d0);
  local_1d0[0] = (string)0x1;
  local_1d0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0._16_4_ = 0x577;
  std::__cxx11::stringstream::stringstream(local_1b8);
  DBImpl::TEST_CompactMemTable((DBImpl *)local_230);
  test::Tester::IsOk((Tester *)local_1d0,(Status *)local_230);
  if ((_func_int **)local_230._0_8_ != (_func_int **)0x0) {
    operator_delete__((void *)local_230._0_8_);
  }
  test::Tester::~Tester((Tester *)local_1d0);
  local_1d0[0] = (string)0x1;
  local_1d0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0._16_4_ = 0x578;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_230._32_8_ = "foo";
  local_230._40_8_ = (FilterPolicy *)0x3;
  DBTest::AllEntriesFor_abi_cxx11_
            ((string *)local_230,&this->super_DBTest,(Slice *)(local_230 + 0x20));
  test::Tester::IsEq<std::__cxx11::string,char[12]>
            ((Tester *)local_1d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
             (char (*) [12])"[ DEL, v1 ]");
  if ((_func_int **)local_230._0_8_ != pp_Var2) {
    operator_delete((void *)local_230._0_8_);
  }
  test::Tester::~Tester((Tester *)local_1d0);
  DBImpl::TEST_CompactRange((DBImpl *)(this->super_DBTest).db_,0,(Slice *)0x0,(Slice *)0x0);
  local_1d0[0] = (string)0x1;
  local_1d0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0._16_4_ = 0x57b;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_230._32_8_ = "foo";
  local_230._40_8_ = (FilterPolicy *)0x3;
  DBTest::AllEntriesFor_abi_cxx11_
            ((string *)local_230,&this->super_DBTest,(Slice *)(local_230 + 0x20));
  test::Tester::IsEq<std::__cxx11::string,char[12]>
            ((Tester *)local_1d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
             (char (*) [12])"[ DEL, v1 ]");
  if ((_func_int **)local_230._0_8_ != pp_Var2) {
    operator_delete((void *)local_230._0_8_);
  }
  test::Tester::~Tester((Tester *)local_1d0);
  DBImpl::TEST_CompactRange((DBImpl *)(this->super_DBTest).db_,1,(Slice *)0x0,(Slice *)0x0);
  local_1d0[0] = (string)0x1;
  local_1d0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_1d0._16_4_ = 0x57f;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_230._32_8_ = "foo";
  local_230._40_8_ = (FilterPolicy *)0x3;
  DBTest::AllEntriesFor_abi_cxx11_
            ((string *)local_230,&this->super_DBTest,(Slice *)(local_230 + 0x20));
  test::Tester::IsEq<std::__cxx11::string,char[4]>
            ((Tester *)local_1d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
             (char (*) [4])"[ ]");
  if ((_func_int **)local_230._0_8_ != pp_Var2) {
    operator_delete((void *)local_230._0_8_);
  }
  test::Tester::~Tester((Tester *)local_1d0);
  return;
}

Assistant:

TEST(DBTest, DeletionMarkers2) {
  Put("foo", "v1");
  ASSERT_OK(dbfull()->TEST_CompactMemTable());
  const int last = config::kMaxMemCompactLevel;
  ASSERT_EQ(NumTableFilesAtLevel(last), 1);  // foo => v1 is now in last level

  // Place a table at level last-1 to prevent merging with preceding mutation
  Put("a", "begin");
  Put("z", "end");
  dbfull()->TEST_CompactMemTable();
  ASSERT_EQ(NumTableFilesAtLevel(last), 1);
  ASSERT_EQ(NumTableFilesAtLevel(last - 1), 1);

  Delete("foo");
  ASSERT_EQ(AllEntriesFor("foo"), "[ DEL, v1 ]");
  ASSERT_OK(dbfull()->TEST_CompactMemTable());  // Moves to level last-2
  ASSERT_EQ(AllEntriesFor("foo"), "[ DEL, v1 ]");
  dbfull()->TEST_CompactRange(last - 2, nullptr, nullptr);
  // DEL kept: "last" file overlaps
  ASSERT_EQ(AllEntriesFor("foo"), "[ DEL, v1 ]");
  dbfull()->TEST_CompactRange(last - 1, nullptr, nullptr);
  // Merging last-1 w/ last, so we are the base level for "foo", so
  // DEL is removed.  (as is v1).
  ASSERT_EQ(AllEntriesFor("foo"), "[ ]");
}